

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitQMark(AsmJSByteCodeGenerator *this,ParseNode *pnode)

{
  EmitExpressionInfo EVar1;
  bool bVar2;
  ParseNodeTri *pPVar3;
  AsmJsCompilationException *pAVar4;
  EmitExpressionInfo local_90;
  EmitExpressionInfo *local_88;
  EmitExpressionInfo *falseInfo;
  AsmJsType local_6c;
  AsmJsType local_68;
  AsmJsType local_64;
  EmitExpressionInfo local_60;
  EmitExpressionInfo *local_58;
  EmitExpressionInfo *trueInfo;
  RegSlot local_48;
  RegSlot floatReg;
  RegSlot doubleReg;
  RegSlot intReg;
  EmitExpressionInfo *local_38;
  EmitExpressionInfo *boolInfo;
  ByteCodeLabel local_28;
  ByteCodeLabel skipLabel;
  ByteCodeLabel falseLabel;
  ByteCodeLabel trueLabel;
  ParseNode *pnode_local;
  AsmJSByteCodeGenerator *this_local;
  EmitExpressionInfo emitInfo;
  
  _falseLabel = pnode;
  pnode_local = (ParseNode *)this;
  pPVar3 = ParseNode::AsParseNodeTri(pnode);
  StartStatement(this,pPVar3->pnode1);
  skipLabel = ByteCodeWriter::DefineLabel(&(this->mWriter).super_ByteCodeWriter);
  local_28 = ByteCodeWriter::DefineLabel(&(this->mWriter).super_ByteCodeWriter);
  boolInfo._4_4_ = ByteCodeWriter::DefineLabel(&(this->mWriter).super_ByteCodeWriter);
  pPVar3 = ParseNode::AsParseNodeTri(_falseLabel);
  EndStatement(this,pPVar3->pnode1);
  pPVar3 = ParseNode::AsParseNodeTri(_falseLabel);
  _doubleReg = EmitBooleanExpression(this,pPVar3->pnode1,skipLabel,local_28);
  local_38 = (EmitExpressionInfo *)&doubleReg;
  AsmJsFunc::ReleaseLocationGeneric(this->mFunction,local_38);
  floatReg = AsmJsFunc::AcquireTmpRegister<int>(this->mFunction);
  local_48 = AsmJsFunc::AcquireTmpRegister<double>(this->mFunction);
  trueInfo._4_4_ = AsmJsFunc::AcquireTmpRegister<float>(this->mFunction);
  AsmJsType::AsmJsType((AsmJsType *)&trueInfo,Void);
  EmitExpressionInfo::EmitExpressionInfo((EmitExpressionInfo *)&this_local,(AsmJsType *)&trueInfo);
  AsmJsByteCodeWriter::MarkAsmJsLabel(&this->mWriter,skipLabel);
  pPVar3 = ParseNode::AsParseNodeTri(_falseLabel);
  local_60 = Emit(this,pPVar3->pnode2);
  local_58 = &local_60;
  pPVar3 = ParseNode::AsParseNodeTri(_falseLabel);
  StartStatement(this,pPVar3->pnode2);
  bVar2 = AsmJsType::isInt(&local_58->type);
  if (bVar2) {
    AsmJsByteCodeWriter::AsmReg2
              (&this->mWriter,Ld_Int,floatReg,(local_58->super_EmitInfoBase).location);
    AsmJsFunc::ReleaseLocation<int>(this->mFunction,local_58);
    AsmJsFunc::ReleaseTmpRegister<double>(this->mFunction,local_48);
    AsmJsFunc::ReleaseTmpRegister<float>(this->mFunction,trueInfo._4_4_);
    this_local._0_4_ = floatReg;
    AsmJsType::AsmJsType(&local_64,Int);
    this_local._4_4_ = local_64.which_;
  }
  else {
    bVar2 = AsmJsType::isDouble(&local_58->type);
    if (bVar2) {
      AsmJsByteCodeWriter::AsmReg2
                (&this->mWriter,Ld_Db,local_48,(local_58->super_EmitInfoBase).location);
      AsmJsFunc::ReleaseLocation<double>(this->mFunction,local_58);
      AsmJsFunc::ReleaseTmpRegister<int>(this->mFunction,floatReg);
      AsmJsFunc::ReleaseTmpRegister<float>(this->mFunction,trueInfo._4_4_);
      this_local._0_4_ = local_48;
      AsmJsType::AsmJsType(&local_68,Double);
      this_local._4_4_ = local_68.which_;
    }
    else {
      bVar2 = AsmJsType::isFloat(&local_58->type);
      if (!bVar2) {
        pAVar4 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar4,L"Conditional expressions must be of type int, double, or float");
        __cxa_throw(pAVar4,&AsmJsCompilationException::typeinfo,0);
      }
      AsmJsByteCodeWriter::AsmReg2
                (&this->mWriter,Ld_Flt,trueInfo._4_4_,(local_58->super_EmitInfoBase).location);
      AsmJsFunc::ReleaseLocation<float>(this->mFunction,local_58);
      AsmJsFunc::ReleaseTmpRegister<int>(this->mFunction,floatReg);
      AsmJsFunc::ReleaseTmpRegister<double>(this->mFunction,local_48);
      this_local._0_4_ = trueInfo._4_4_;
      AsmJsType::AsmJsType(&local_6c,Float);
      this_local._4_4_ = local_6c.which_;
    }
  }
  AsmJsByteCodeWriter::AsmBr(&this->mWriter,boolInfo._4_4_,AsmBr);
  pPVar3 = ParseNode::AsParseNodeTri(_falseLabel);
  EndStatement(this,pPVar3->pnode2);
  AsmJsByteCodeWriter::MarkAsmJsLabel(&this->mWriter,local_28);
  pPVar3 = ParseNode::AsParseNodeTri(_falseLabel);
  local_90 = Emit(this,pPVar3->pnode3);
  local_88 = &local_90;
  pPVar3 = ParseNode::AsParseNodeTri(_falseLabel);
  StartStatement(this,pPVar3->pnode3);
  bVar2 = AsmJsType::isInt(&local_88->type);
  if (bVar2) {
    bVar2 = AsmJsType::isInt(&local_58->type);
    if (!bVar2) {
      pAVar4 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (pAVar4,L"Conditional expressions results must be the same type");
      __cxa_throw(pAVar4,&AsmJsCompilationException::typeinfo,0);
    }
    AsmJsByteCodeWriter::AsmReg2
              (&this->mWriter,Ld_Int,floatReg,(local_88->super_EmitInfoBase).location);
    AsmJsFunc::ReleaseLocation<int>(this->mFunction,local_88);
  }
  else {
    bVar2 = AsmJsType::isDouble(&local_88->type);
    if (bVar2) {
      bVar2 = AsmJsType::isDouble(&local_58->type);
      if (!bVar2) {
        pAVar4 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar4,L"Conditional expressions results must be the same type");
        __cxa_throw(pAVar4,&AsmJsCompilationException::typeinfo,0);
      }
      AsmJsByteCodeWriter::AsmReg2
                (&this->mWriter,Ld_Db,local_48,(local_88->super_EmitInfoBase).location);
      AsmJsFunc::ReleaseLocation<double>(this->mFunction,local_88);
    }
    else {
      bVar2 = AsmJsType::isFloat(&local_88->type);
      if (!bVar2) {
        pAVar4 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar4,L"Conditional expressions must be of type int, double, or float");
        __cxa_throw(pAVar4,&AsmJsCompilationException::typeinfo,0);
      }
      bVar2 = AsmJsType::isFloat(&local_58->type);
      if (!bVar2) {
        pAVar4 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (pAVar4,L"Conditional expressions results must be the same type");
        __cxa_throw(pAVar4,&AsmJsCompilationException::typeinfo,0);
      }
      AsmJsByteCodeWriter::AsmReg2
                (&this->mWriter,Ld_Flt,trueInfo._4_4_,(local_88->super_EmitInfoBase).location);
      AsmJsFunc::ReleaseLocation<float>(this->mFunction,local_88);
    }
  }
  AsmJsByteCodeWriter::MarkAsmJsLabel(&this->mWriter,boolInfo._4_4_);
  pPVar3 = ParseNode::AsParseNodeTri(_falseLabel);
  EndStatement(this,pPVar3->pnode3);
  EVar1.type.which_ = this_local._4_4_;
  EVar1.super_EmitInfoBase.location = this_local._0_4_;
  return EVar1;
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitQMark( ParseNode * pnode )
    {
        StartStatement(pnode->AsParseNodeTri()->pnode1);
        Js::ByteCodeLabel trueLabel = mWriter.DefineLabel();
        Js::ByteCodeLabel falseLabel = mWriter.DefineLabel();
        Js::ByteCodeLabel skipLabel = mWriter.DefineLabel();
        EndStatement(pnode->AsParseNodeTri()->pnode1);
        const EmitExpressionInfo& boolInfo = EmitBooleanExpression( pnode->AsParseNodeTri()->pnode1, trueLabel, falseLabel );
        mFunction->ReleaseLocationGeneric( &boolInfo );

        RegSlot intReg = mFunction->AcquireTmpRegister<int>();
        RegSlot doubleReg = mFunction->AcquireTmpRegister<double>();
        RegSlot floatReg = mFunction->AcquireTmpRegister<float>();
        EmitExpressionInfo emitInfo( AsmJsType::Void );


        mWriter.MarkAsmJsLabel( trueLabel );
        const EmitExpressionInfo& trueInfo = Emit( pnode->AsParseNodeTri()->pnode2 );
        StartStatement(pnode->AsParseNodeTri()->pnode2);
        if( trueInfo.type.isInt() )
        {
            mWriter.AsmReg2( Js::OpCodeAsmJs::Ld_Int, intReg, trueInfo.location );
            mFunction->ReleaseLocation<int>( &trueInfo );
            mFunction->ReleaseTmpRegister<double>(doubleReg);
            mFunction->ReleaseTmpRegister<float>(floatReg);
            emitInfo.location = intReg;
            emitInfo.type = AsmJsType::Int;
        }
        else if( trueInfo.type.isDouble() )
        {
            mWriter.AsmReg2( Js::OpCodeAsmJs::Ld_Db, doubleReg, trueInfo.location );
            mFunction->ReleaseLocation<double>( &trueInfo );
            mFunction->ReleaseTmpRegister<int>( intReg );
            mFunction->ReleaseTmpRegister<float>(floatReg);
            emitInfo.location = doubleReg;
            emitInfo.type = AsmJsType::Double;
        }
        else if (trueInfo.type.isFloat())
        {
            mWriter.AsmReg2(Js::OpCodeAsmJs::Ld_Flt, floatReg, trueInfo.location);
            mFunction->ReleaseLocation<float>(&trueInfo);
            mFunction->ReleaseTmpRegister<int>(intReg);
            mFunction->ReleaseTmpRegister<double>(doubleReg);
            emitInfo.location = floatReg;
            emitInfo.type = AsmJsType::Float;
        }
        else
        {
            throw AsmJsCompilationException(_u("Conditional expressions must be of type int, double, or float"));
        }
        mWriter.AsmBr( skipLabel );
        EndStatement(pnode->AsParseNodeTri()->pnode2);
        mWriter.MarkAsmJsLabel( falseLabel );
        const EmitExpressionInfo& falseInfo = Emit( pnode->AsParseNodeTri()->pnode3 );
        StartStatement(pnode->AsParseNodeTri()->pnode3);
        if( falseInfo.type.isInt() )
        {
            if( !trueInfo.type.isInt() )
            {
                throw AsmJsCompilationException( _u("Conditional expressions results must be the same type") );
            }
            mWriter.AsmReg2( Js::OpCodeAsmJs::Ld_Int, intReg, falseInfo.location );
            mFunction->ReleaseLocation<int>( &falseInfo );
        }
        else if( falseInfo.type.isDouble() )
        {
            if( !trueInfo.type.isDouble() )
            {
                throw AsmJsCompilationException( _u("Conditional expressions results must be the same type") );
            }
            mWriter.AsmReg2( Js::OpCodeAsmJs::Ld_Db, doubleReg, falseInfo.location );
            mFunction->ReleaseLocation<double>( &falseInfo );
        }
        else if(falseInfo.type.isFloat())
        {
            if (!trueInfo.type.isFloat())
            {
                throw AsmJsCompilationException(_u("Conditional expressions results must be the same type"));
            }
            mWriter.AsmReg2(Js::OpCodeAsmJs::Ld_Flt, floatReg, falseInfo.location);
            mFunction->ReleaseLocation<float>(&falseInfo);
        }
        else
        {
            throw AsmJsCompilationException(_u("Conditional expressions must be of type int, double, or float"));
        }
        mWriter.MarkAsmJsLabel( skipLabel );
        EndStatement(pnode->AsParseNodeTri()->pnode3);
        return emitInfo;
    }